

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formula.cpp
# Opt level: O2

void __thiscall Am_Formula::Am_Formula(Am_Formula *this,Am_FProc_Int *formula,char *name)

{
  Am_Formula_Data *pAVar1;
  
  (this->super_Am_Registered_Type)._vptr_Am_Registered_Type = (_func_int **)&PTR_ID_002ea6f0;
  pAVar1 = (Am_Formula_Data *)operator_new(0x20);
  pAVar1->type = F_INT;
  pAVar1->stored_data = (Am_Wrapper *)0x0;
  pAVar1->refs = 1;
  this->data = pAVar1;
  (pAVar1->form_data).f_int = formula;
  return;
}

Assistant:

Am_Formula::Am_Formula(Am_FProc_Int *formula, const char *name)
{
  data = new Am_Formula_Data(F_INT, name);
  data->form_data.f_int = formula;
}